

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

uint32_t prf_model_add_vertex(prf_model_t *model,prf_vertex_t *vertex)

{
  bool_t bVar1;
  int iVar2;
  void *pvVar3;
  undefined2 *puVar4;
  undefined8 *in_RSI;
  long in_RDI;
  prf_vertex_with_texture_data *data_3;
  prf_vertex_with_normal_and_texture_data *data_2;
  prf_vertex_with_normal_data *data_1;
  prf_vertex_with_color_data *data;
  int count;
  int i;
  uint16_t length;
  uint16_t opcode;
  prf_vertex_pool_t *pool;
  uint32_t offset;
  uint16_t *ptr16;
  uint8_t *ptr8;
  prf_model_t *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  int local_40;
  ushort local_3c;
  undefined2 local_3a;
  long *local_38;
  uint32_t local_2c;
  uint32_t local_4;
  
  local_38 = (long *)0x0;
  if ((*(long *)(in_RDI + 0x18) == 0) &&
     (bVar1 = prf_vertextras_init(in_stack_ffffffffffffff90), bVar1 == 0)) {
    local_4 = 0;
  }
  else {
    if (*(int *)(in_RSI + 7) == 0) {
      if (*(int *)((long)in_RSI + 0x3c) == 0) {
        local_3a = 0x44;
        local_3c = 0x28;
      }
      else {
        local_3a = 0x47;
        local_3c = 0x30;
      }
    }
    else if (*(int *)((long)in_RSI + 0x3c) == 0) {
      local_3a = 0x45;
      local_3c = 0x34;
    }
    else {
      local_3a = 0x46;
      local_3c = 0x3c;
    }
    local_2c = **(uint32_t **)(*(long *)(in_RDI + 0x10) + 8);
    iVar2 = prf_array_count((void *)0x104ad3);
    for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
      local_38 = *(long **)(*(long *)(in_RDI + 0x18) + (long)local_40 * 8);
      local_2c = *(int *)((long)local_38 + 0xc) + local_2c;
    }
    if ((uint)((int)local_38[1] - *(int *)((long)local_38 + 0xc)) < (uint)local_3c) {
      local_38 = (long *)malloc(0x10);
      pvVar3 = malloc(0x8000);
      *local_38 = (long)pvVar3;
      *(undefined4 *)(local_38 + 1) = 0x8000;
      *(undefined4 *)((long)local_38 + 0xc) = 0;
      pvVar3 = prf_array_append_ptr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      *(void **)(in_RDI + 0x18) = pvVar3;
    }
    puVar4 = (undefined2 *)(*local_38 + (ulong)*(uint *)((long)local_38 + 0xc));
    *(uint *)((long)local_38 + 0xc) = *(int *)((long)local_38 + 0xc) + (uint)local_3c;
    *puVar4 = local_3a;
    puVar4[1] = local_3c;
    switch(local_3a) {
    case 0x44:
      *(undefined8 *)(puVar4 + 2) = *in_RSI;
      *(undefined8 *)(puVar4 + 6) = in_RSI[1];
      *(undefined8 *)(puVar4 + 10) = in_RSI[2];
      puVar4[0xe] = *(undefined2 *)(in_RSI + 3);
      puVar4[0xf] = *(undefined2 *)((long)in_RSI + 0x1a);
      *(undefined4 *)(puVar4 + 0x10) = *(undefined4 *)(in_RSI + 6);
      *(undefined4 *)(puVar4 + 0x12) = *(undefined4 *)((long)in_RSI + 0x34);
      break;
    case 0x45:
      *(undefined8 *)(puVar4 + 2) = *in_RSI;
      *(undefined8 *)(puVar4 + 6) = in_RSI[1];
      *(undefined8 *)(puVar4 + 10) = in_RSI[2];
      puVar4[0xe] = *(undefined2 *)(in_RSI + 3);
      puVar4[0xf] = *(undefined2 *)((long)in_RSI + 0x1a);
      *(undefined4 *)(puVar4 + 0x10) = *(undefined4 *)((long)in_RSI + 0x1c);
      *(undefined4 *)(puVar4 + 0x12) = *(undefined4 *)(in_RSI + 4);
      *(undefined4 *)(puVar4 + 0x14) = *(undefined4 *)((long)in_RSI + 0x24);
      *(undefined4 *)(puVar4 + 0x16) = *(undefined4 *)(in_RSI + 6);
      *(undefined4 *)(puVar4 + 0x18) = *(undefined4 *)((long)in_RSI + 0x34);
      break;
    case 0x46:
      *(undefined8 *)(puVar4 + 2) = *in_RSI;
      *(undefined8 *)(puVar4 + 6) = in_RSI[1];
      *(undefined8 *)(puVar4 + 10) = in_RSI[2];
      puVar4[0xe] = *(undefined2 *)(in_RSI + 3);
      puVar4[0xf] = *(undefined2 *)((long)in_RSI + 0x1a);
      *(undefined4 *)(puVar4 + 0x10) = *(undefined4 *)((long)in_RSI + 0x1c);
      *(undefined4 *)(puVar4 + 0x12) = *(undefined4 *)(in_RSI + 4);
      *(undefined4 *)(puVar4 + 0x14) = *(undefined4 *)((long)in_RSI + 0x24);
      *(undefined4 *)(puVar4 + 0x16) = *(undefined4 *)(in_RSI + 5);
      *(undefined4 *)(puVar4 + 0x18) = *(undefined4 *)((long)in_RSI + 0x2c);
      *(undefined4 *)(puVar4 + 0x1a) = *(undefined4 *)(in_RSI + 6);
      *(undefined4 *)(puVar4 + 0x1c) = *(undefined4 *)((long)in_RSI + 0x34);
      break;
    case 0x47:
      *(undefined8 *)(puVar4 + 2) = *in_RSI;
      *(undefined8 *)(puVar4 + 6) = in_RSI[1];
      *(undefined8 *)(puVar4 + 10) = in_RSI[2];
      puVar4[0xe] = *(undefined2 *)(in_RSI + 3);
      puVar4[0xf] = *(undefined2 *)((long)in_RSI + 0x1a);
      *(undefined4 *)(puVar4 + 0x10) = *(undefined4 *)(in_RSI + 5);
      *(undefined4 *)(puVar4 + 0x12) = *(undefined4 *)((long)in_RSI + 0x2c);
      *(undefined4 *)(puVar4 + 0x14) = *(undefined4 *)(in_RSI + 6);
      *(undefined4 *)(puVar4 + 0x16) = *(undefined4 *)((long)in_RSI + 0x34);
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

uint32_t
prf_model_add_vertex( 
    prf_model_t * model,
    prf_vertex_t * vertex )
{
    uint8_t * ptr8;
    uint16_t * ptr16;

    uint32_t offset;
    prf_vertex_pool_t * pool = NULL;
    uint16_t opcode;
    uint16_t length;
    int i, count;

    assert( model != NULL && vertex != NULL );
    assert( model->vertex_palette != NULL );

    if ( model->vertextras == NULL ) {
        if ( prf_vertextras_init( model ) == FALSE )
            return FALSE;
    }
    if ( vertex->has_normal != FALSE ) {
        if ( vertex->has_texture != FALSE ) {
            opcode = 70;
            length = 4+3*8+4+5*4+4+4;
        } else {
            opcode = 69;
            length = 4+3*8+4+3*4+4+4;
        }
    } else {
        if ( vertex->has_texture != FALSE ) {
            opcode = 71;
            length = 4+3*8+4+2*4+4+4;
        } else {
            opcode = 68;
            length = 4+3*8+4+4+4;
        }
    }

    offset = ((uint32_t *) (model->vertex_palette->data))[0];
    count = prf_array_count( model->vertextras );
    for ( i = 0; i < count; i++ ) {
        pool = model->vertextras[ i ];
        offset += pool->position;
    }

    if ( pool->data_size - pool->position < length ) {
        pool = (prf_vertex_pool_t *)malloc( sizeof( prf_vertex_pool_t ) );
        assert( pool != NULL );
        pool->data = (uint8_t *)malloc( PRF_POOL_BLOCK_SIZE );
        assert( pool->data != NULL );
        pool->data_size = PRF_POOL_BLOCK_SIZE;
        pool->position = 0;
        model->vertextras = (struct prf_vertex_pool_s **)
          prf_array_append_ptr( model->vertextras, pool);
    }

    ptr8 = pool->data + pool->position;
    ptr16 = (uint16_t *) ptr8;
    pool->position += length;

    ptr16[0] = opcode;
    ptr16[1] = length;

    switch ( opcode ) {
    case 68: /* vertex_with_color */
        do {
            struct prf_vertex_with_color_data * data;
            data = (struct prf_vertex_with_color_data *) (ptr8 + 4);
            prf_dblwrite( data->x, vertex->x );
            prf_dblwrite( data->y, vertex->y );
            prf_dblwrite( data->z, vertex->z );
            data->color_name_index = vertex->color_name_index;
            data->flags = vertex->flags;
            data->packed_color = vertex->packed_color;
            data->color_index = vertex->color_index;
        } while ( FALSE );
        break;
    case 69: /* vertex_with_normal */
        do {
            struct prf_vertex_with_normal_data * data;
            data = (struct prf_vertex_with_normal_data *) (ptr8 + 4);
            prf_dblwrite( data->x, vertex->x );
            prf_dblwrite( data->y, vertex->y );
            prf_dblwrite( data->z, vertex->z );
            data->color_name_index = vertex->color_name_index;
            data->flags = vertex->flags;
            data->normal[0] = vertex->normal[0];
            data->normal[1] = vertex->normal[1];
            data->normal[2] = vertex->normal[2];
            data->packed_color = vertex->packed_color;
            data->color_index = vertex->color_index;
        } while ( FALSE );
        break;
    case 70: /* vertex_with_normal_and_texture */
        do {
            struct prf_vertex_with_normal_and_texture_data * data;
            data = (struct prf_vertex_with_normal_and_texture_data *) (ptr8+4);
            prf_dblwrite( data->x, vertex->x );
            prf_dblwrite( data->y, vertex->y );
            prf_dblwrite( data->z, vertex->z );
            data->color_name_index = vertex->color_name_index;
            data->flags = vertex->flags;
            data->normal[0] = vertex->normal[0];
            data->normal[1] = vertex->normal[1];
            data->normal[2] = vertex->normal[2];
            data->texture[0] = vertex->texture[0];
            data->texture[1] = vertex->texture[1];
            data->packed_color = vertex->packed_color;
            data->color_index = vertex->color_index;
        } while ( FALSE );
        break;
    case 71: /* vertex_with_texture */
        do {
            struct prf_vertex_with_texture_data * data;
            data = (struct prf_vertex_with_texture_data *) (ptr8 + 4);
            prf_dblwrite( data->x, vertex->x );
            prf_dblwrite( data->y, vertex->y );
            prf_dblwrite( data->z, vertex->z );
            data->color_name_index = vertex->color_name_index;
            data->flags = vertex->flags;
            data->texture[0] = vertex->texture[0];
            data->texture[1] = vertex->texture[1];
            data->packed_color = vertex->packed_color;
            data->color_index = vertex->color_index;
        } while ( FALSE );
        break;
    default:
        assert( 0 && "invalid opcode - how did this happen?" );
        break;
    }
    
    return offset;
}